

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool *v;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  int *piVar9;
  int *piVar10;
  bool bVar11;
  ImGuiContext *g_1;
  ImDrawList *pIVar12;
  ImU32 col;
  ImGuiContext *g;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  int rect_n;
  int iVar16;
  ImGuiTable *pIVar17;
  ImGuiTableSettings *settings;
  bool bVar18;
  ImGuiContext *pIVar19;
  undefined **ppuVar20;
  long lVar21;
  char **ppcVar22;
  char *pcVar23;
  int n;
  ImVector<ImDrawList_*> *pIVar24;
  int rect_n_1;
  ulong uVar25;
  ImGuiContext *g_7;
  uint *puVar26;
  uint uVar27;
  ImGuiWindow *window;
  ulong uVar28;
  byte bVar29;
  float fVar30;
  float fVar31;
  float extraout_XMM0_Db;
  float fVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ImRect IVar38;
  ImVec2 local_1c8;
  ImGuiContext *local_1c0;
  ImGuiMetricsConfig *local_1b8;
  int *local_1b0;
  int *local_1a8;
  ImVec2 local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  bVar29 = 0;
  bVar11 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar19 = GImGui;
  if (!bVar11) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.81");
  uVar33 = 0;
  uVar34 = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",
       SUB84((double)(1000.0 / (pIVar19->IO).Framerate),0));
  iVar16 = (pIVar19->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar19->IO).MetricsRenderVertices,
       (long)iVar16,(ulong)(uint)(iVar16 / 3));
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar19->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar19->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar19->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  ppuVar20 = &PTR_anon_var_dwarf_8307a_0019aab0;
  ppcVar22 = trt_rects_names;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    *ppcVar22 = *ppuVar20;
    ppuVar20 = ppuVar20 + (ulong)bVar29 * -2 + 1;
    ppcVar22 = ppcVar22 + (ulong)bVar29 * -2 + 1;
  }
  local_1b0 = &(pIVar19->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar19->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1b0 = 4;
  }
  local_1a8 = &(pIVar19->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar19->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1a8 = 2;
  }
  local_1b8 = &pIVar19->DebugMetricsConfig;
  bVar11 = TreeNode("Tools");
  local_1c0 = pIVar19;
  if (bVar11) {
    auVar7._8_8_ = 0;
    auVar7[0] = buf[8];
    auVar7[1] = buf[9];
    auVar7[2] = buf[10];
    auVar7[3] = buf[0xb];
    auVar7[4] = buf[0xc];
    auVar7[5] = buf[0xd];
    auVar7[6] = buf[0xe];
    auVar7[7] = buf[0xf];
    buf._0_16_ = auVar7 << 0x40;
    bVar11 = Button("Item Picker..",(ImVec2 *)buf);
    pIVar8 = GImGui;
    if (bVar11) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar3 = pIVar8->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    TextDisabled("(?)");
    bVar11 = IsItemHovered(0);
    if (bVar11) {
      BeginTooltipEx(0,0);
      PushTextWrapPos(GImGui->FontSize * 35.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      iVar16 = (pIVar3->DC).TextWrapPosStack.Size;
      (pIVar3->DC).TextWrapPos = (pIVar3->DC).TextWrapPosStack.Data[(long)iVar16 + -1];
      (pIVar3->DC).TextWrapPosStack.Size = iVar16 + -1;
      End();
    }
    Checkbox("Show windows begin order",&(pIVar19->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1b8->ShowWindowsRects);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar30 = pIVar8->FontSize;
    *(byte *)&(pIVar8->NextItemData).Flags = (byte)(pIVar8->NextItemData).Flags | 1;
    (pIVar8->NextItemData).Width = fVar30 * 12.0;
    bVar11 = Combo("##show_windows_rect_type",local_1b0,wrt_rects_names,8,8);
    local_1b8->ShowWindowsRects = (bool)(local_1b8->ShowWindowsRects | bVar11);
    if ((local_1b8->ShowWindowsRects != false) && (pIVar19->NavWindow != (ImGuiWindow *)0x0)) {
      lVar13 = 0;
      BulletText("\'%s\':",pIVar19->NavWindow->Name);
      pIVar8 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar30 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar30;
      (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      do {
        IVar38 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar19->NavWindow,(int)lVar13);
        uVar33 = 0;
        uVar34 = 0;
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar38.Min.x,0),
             SUB84((double)IVar38.Min.y,0),SUB84((double)IVar38.Max.x,0),(double)IVar38.Max.y,
             (double)(IVar38.Max.x - IVar38.Min.x),(double)(IVar38.Max.y - IVar38.Min.y),
             wrt_rects_names[lVar13]);
        pIVar8 = GImGui;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar30 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar30;
      (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar19->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar19->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    v = &(pIVar19->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",v);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar30 = pIVar8->FontSize;
    *(byte *)&(pIVar8->NextItemData).Flags = (byte)(pIVar8->NextItemData).Flags | 1;
    (pIVar8->NextItemData).Width = fVar30 * 12.0;
    bVar11 = Combo("##show_table_rects_type",local_1a8,trt_rects_names,0xd,0xd);
    *v = (bool)(*v | bVar11);
    if (((*v != false) && (pIVar19->NavWindow != (ImGuiWindow *)0x0)) &&
       (iVar16 = (pIVar19->Tables).Buf.Size, 0 < iVar16)) {
      lVar13 = 0;
      do {
        pIVar17 = (pIVar19->Tables).Buf.Data;
        if (pIVar19->FrameCount + -1 <= pIVar17[lVar13].LastFrameActive) {
          pIVar17 = pIVar17 + lVar13;
          if ((pIVar17->OuterWindow == pIVar19->NavWindow) ||
             (pIVar17->InnerWindow == pIVar19->NavWindow)) {
            local_178._0_8_ = lVar13;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar17->ID,
                       (ulong)(uint)pIVar17->ColumnsCount,pIVar17->OuterWindow->Name);
            bVar11 = IsItemHovered(0);
            if (bVar11) {
              pIVar12 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
              auVar7 = buf._0_16_;
              IVar1 = (pIVar17->OuterRect).Min;
              buf._4_4_ = IVar1.y + -1.0;
              buf._0_4_ = IVar1.x + -1.0;
              buf._8_8_ = auVar7._8_8_;
              IVar1 = (pIVar17->OuterRect).Max;
              local_1c8.y = IVar1.y + 1.0;
              local_1c8.x = IVar1.x + 1.0;
              uVar33 = 0;
              uVar34 = 0;
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,&local_1c8,0xff00ffff,0.0,-1,2.0);
            }
            pIVar19 = GImGui;
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar30 = (pIVar19->Style).IndentSpacing + (pIVar3->DC).Indent.x;
            (pIVar3->DC).Indent.x = fVar30;
            (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            uVar25 = 0;
            do {
              iVar16 = (int)uVar25;
              if (uVar25 < 6) {
                IVar38 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar16,-1);
                local_198._0_8_ = IVar38.Max;
                local_198._8_4_ = uVar33;
                local_198._12_4_ = uVar34;
                uVar33 = 0;
                uVar34 = 0;
                fStack_180 = (float)extraout_XMM0_Dc_00;
                local_188._0_4_ = IVar38.Min.x;
                local_188._4_4_ = IVar38.Min.y;
                fStack_17c = (float)extraout_XMM0_Dd_00;
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar38.Min.x,0),SUB84((double)IVar38.Min.y,0),
                               SUB84((double)IVar38.Max.x,0),(double)IVar38.Max.y,
                               (double)(IVar38.Max.x - IVar38.Min.x),
                               (double)(IVar38.Max.y - IVar38.Min.y),trt_rects_names[uVar25]);
                local_1c8.x = 0.0;
                local_1c8.y = 0.0;
                Selectable(buf,false,0,&local_1c8);
                bVar11 = IsItemHovered(0);
                if (bVar11) {
                  pIVar12 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                  local_1c8.y = (float)local_188._4_4_ + -1.0;
                  local_1c8.x = (float)local_188._0_4_ + -1.0;
                  local_1a0.y = (float)local_198._4_4_ + 1.0;
                  local_1a0.x = (float)local_198._0_4_ + 1.0;
                  uVar33 = 0;
                  uVar34 = 0;
                  ImDrawList::AddRect(pIVar12,&local_1c8,&local_1a0,0xff00ffff,0.0,-1,2.0);
                }
              }
              else if (((iVar16 == 8) || (iVar16 == 6)) && (0 < pIVar17->ColumnsCount)) {
                uVar28 = 0;
                do {
                  IVar38 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar16,(int)uVar28);
                  local_198._0_8_ = IVar38.Max;
                  local_198._8_4_ = uVar33;
                  local_198._12_4_ = uVar34;
                  uVar33 = 0;
                  uVar34 = 0;
                  fStack_180 = (float)extraout_XMM0_Dc;
                  local_188._0_4_ = IVar38.Min.x;
                  local_188._4_4_ = IVar38.Min.y;
                  fStack_17c = (float)extraout_XMM0_Dd;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,SUB84((double)IVar38.Min.x,0),SUB84((double)IVar38.Min.y,0),
                                 SUB84((double)IVar38.Max.x,0),(double)IVar38.Max.y,
                                 (double)(IVar38.Max.x - IVar38.Min.x),
                                 (double)(IVar38.Max.y - IVar38.Min.y),uVar28,
                                 trt_rects_names[uVar25]);
                  local_1c8.x = 0.0;
                  local_1c8.y = 0.0;
                  Selectable(buf,false,0,&local_1c8);
                  bVar11 = IsItemHovered(0);
                  if (bVar11) {
                    pIVar12 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                    local_1c8.y = (float)local_188._4_4_ + -1.0;
                    local_1c8.x = (float)local_188._0_4_ + -1.0;
                    local_1a0.y = (float)local_198._4_4_ + 1.0;
                    local_1a0.x = (float)local_198._0_4_ + 1.0;
                    uVar33 = 0;
                    uVar34 = 0;
                    ImDrawList::AddRect(pIVar12,&local_1c8,&local_1a0,0xff00ffff,0.0,-1,2.0);
                  }
                  uVar27 = (int)uVar28 + 1;
                  uVar28 = (ulong)uVar27;
                } while ((int)uVar27 < pIVar17->ColumnsCount);
              }
              pIVar19 = GImGui;
              uVar25 = uVar25 + 1;
            } while (uVar25 != 0xd);
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar30 = (pIVar3->DC).Indent.x - (pIVar19->Style).IndentSpacing;
            (pIVar3->DC).Indent.x = fVar30;
            (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            iVar16 = (local_1c0->Tables).Buf.Size;
            lVar13 = local_178._0_8_;
            pIVar19 = local_1c0;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar16);
    }
    TreePop();
  }
  local_198._0_8_ = &pIVar19->Windows;
  DebugNodeWindowsList(&pIVar19->Windows,"Windows");
  lVar13 = (long)(pIVar19->Viewports).Size;
  if (lVar13 < 1) {
    uVar25 = 0;
  }
  else {
    lVar21 = 0;
    uVar25 = 0;
    do {
      pIVar4 = (pIVar19->Viewports).Data[lVar21];
      uVar25 = (ulong)(uint)((int)uVar25 + (pIVar4->DrawDataBuilder).Layers[0].Size +
                            (pIVar4->DrawDataBuilder).Layers[1].Size);
      lVar21 = lVar21 + 1;
    } while (lVar13 != lVar21);
  }
  bVar11 = TreeNode("DrawLists","DrawLists (%d)",uVar25);
  if (bVar11) {
    if (0 < (pIVar19->Viewports).Size) {
      lVar13 = 0;
      do {
        pIVar4 = (pIVar19->Viewports).Data[lVar13];
        lVar21 = 0;
        bVar11 = true;
        do {
          bVar18 = bVar11;
          if (0 < (pIVar4->DrawDataBuilder).Layers[lVar21].Size) {
            pIVar24 = (pIVar4->DrawDataBuilder).Layers + lVar21;
            lVar21 = 0;
            do {
              DebugNodeDrawList((ImGuiWindow *)0x0,pIVar24->Data[lVar21],"DrawList");
              lVar21 = lVar21 + 1;
            } while (lVar21 < pIVar24->Size);
          }
          lVar21 = 1;
          bVar11 = false;
        } while (bVar18);
        lVar13 = lVar13 + 1;
        pIVar19 = local_1c0;
      } while (lVar13 < (local_1c0->Viewports).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar19->Viewports).Size);
  if (bVar11) {
    fVar30 = GetTreeNodeToLabelSpacing();
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar35 = extraout_XMM0_Db;
    if ((fVar30 == 0.0) && (!NAN(fVar30))) {
      fVar30 = (pIVar8->Style).IndentSpacing;
      fVar35 = 0.0;
    }
    fVar30 = fVar30 + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar30;
    fVar30 = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    (pIVar3->DC).CursorPos.x = fVar30;
    lVar13 = (long)(pIVar8->Viewports).Size;
    if (lVar13 < 1) {
      buf._0_4_ = -INFINITY;
      buf._4_4_ = -INFINITY;
    }
    else {
      lVar21 = 0;
      local_178 = _DAT_0017efe0;
      local_168 = _DAT_0017ef40;
      do {
        pIVar4 = (pIVar8->Viewports).Data[lVar21];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        auVar37._8_8_ = 0;
        auVar37._0_4_ = IVar1.x;
        auVar37._4_4_ = IVar1.y;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        auVar36._0_4_ = IVar2.x + IVar1.x;
        auVar36._4_4_ = IVar2.y + IVar1.y;
        auVar36._8_8_ = 0;
        local_178 = maxps(auVar36,local_178);
        local_168 = minps(auVar37,local_168);
        lVar21 = lVar21 + 1;
      } while (lVar13 != lVar21);
      local_188._0_4_ = fVar30 + local_168._0_4_ * -0.125;
      local_188._4_4_ = (pIVar3->DC).CursorPos.y + local_168._4_4_ * -0.125;
      lVar13 = 0;
      fStack_180 = fVar35 + local_168._8_4_ * 0.0;
      fStack_17c = local_168._12_4_ * 0.0 + 0.0;
      fVar30 = (float)local_188._0_4_;
      fVar35 = (float)local_188._4_4_;
      do {
        pIVar4 = (pIVar8->Viewports).Data[lVar13];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        fVar31 = IVar1.x;
        fVar32 = IVar1.y;
        IVar1 = (pIVar4->super_ImGuiViewport).Size;
        buf._4_4_ = fVar32 * 0.125 + fVar35;
        buf._0_4_ = fVar31 * 0.125 + fVar30;
        buf._8_4_ = (IVar1.x + fVar31) * 0.125 + fVar30;
        buf._12_4_ = (IVar1.y + fVar32) * 0.125 + fVar35;
        DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf);
        lVar13 = lVar13 + 1;
        fVar30 = (float)local_188._0_4_;
        fVar35 = (float)local_188._4_4_;
      } while (lVar13 < (pIVar8->Viewports).Size);
      buf._0_4_ = ((float)local_178._0_4_ - (float)local_168._0_4_) * 0.125;
      buf._4_4_ = ((float)local_178._4_4_ - (float)local_168._4_4_) * 0.125;
    }
    Dummy((ImVec2 *)buf);
    fVar30 = GetTreeNodeToLabelSpacing();
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if ((fVar30 == 0.0) && (!NAN(fVar30))) {
      fVar30 = (pIVar8->Style).IndentSpacing;
    }
    fVar30 = (pIVar3->DC).Indent.x - fVar30;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    if (0 < (pIVar19->Viewports).Size) {
      lVar13 = 0;
      do {
        DebugNodeViewport((pIVar19->Viewports).Data[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pIVar19->Viewports).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar19->OpenPopupStack).Size);
  if (bVar11) {
    if (0 < (pIVar19->OpenPopupStack).Size) {
      lVar21 = 8;
      lVar13 = 0;
      do {
        pIVar5 = (pIVar19->OpenPopupStack).Data;
        puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar21);
        pcVar14 = "";
        pcVar15 = "NULL";
        pcVar23 = "";
        if (puVar6 != (undefined8 *)0x0) {
          pcVar15 = (char *)*puVar6;
          pcVar14 = " ChildWindow";
          if ((*(uint *)((long)puVar6 + 0xc) >> 0x18 & 1) == 0) {
            pcVar14 = "";
          }
          pcVar23 = " ChildMenu";
          if ((*(uint *)((long)puVar6 + 0xc) >> 0x1c & 1) == 0) {
            pcVar23 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar5 + lVar21 + -8),
                   pcVar15,pcVar14,pcVar23);
        lVar13 = lVar13 + 1;
        lVar21 = lVar21 + 0x30;
        pIVar19 = local_1c0;
      } while (lVar13 < (local_1c0->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar19->TabBars).Buf.Size);
  if (bVar11) {
    if (0 < (pIVar19->TabBars).Buf.Size) {
      lVar13 = 0;
      lVar21 = 0;
      do {
        DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar19->TabBars).Buf.Data)->Tabs).Size + lVar13),
                        "TabBar");
        lVar21 = lVar21 + 1;
        lVar13 = lVar13 + 0x98;
      } while (lVar21 < (pIVar19->TabBars).Buf.Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar19->Tables).Buf.Size);
  if (bVar11) {
    if (0 < (pIVar19->Tables).Buf.Size) {
      lVar13 = 0;
      lVar21 = 0;
      do {
        DebugNodeTable((ImGuiTable *)((long)&((pIVar19->Tables).Buf.Data)->ID + lVar13));
        lVar21 = lVar21 + 1;
        lVar13 = lVar13 + 600;
      } while (lVar21 < (pIVar19->Tables).Buf.Size);
    }
    TreePop();
  }
  bVar11 = TreeNode("Settings");
  if (bVar11) {
    bVar11 = SmallButton("Clear");
    if (bVar11) {
      ClearIniSettings();
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar11 = SmallButton("Save to memory");
    if (bVar11) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar11 = SmallButton("Save to disk");
    if (bVar11) {
      SaveIniSettingsToDisk((pIVar19->IO).IniFilename);
    }
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    if ((pIVar19->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar19->SettingsDirtyTimer,0));
    bVar11 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar19->SettingsHandlers).Size);
    if (bVar11) {
      if (0 < (pIVar19->SettingsHandlers).Size) {
        lVar13 = 0;
        lVar21 = 0;
        do {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar19->SettingsHandlers).Data)->TypeName + lVar13));
          lVar21 = lVar21 + 1;
          lVar13 = lVar13 + 0x48;
        } while (lVar21 < (pIVar19->SettingsHandlers).Size);
      }
      TreePop();
    }
    bVar11 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar19->SettingsWindows).Buf.Size);
    if (bVar11) {
      pcVar15 = (pIVar19->SettingsWindows).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        puVar26 = (uint *)(pcVar15 + 4);
        do {
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)*puVar26,puVar26 + 4,
               (ulong)(uint)(int)(short)puVar26[1],(ulong)(uint)(int)*(short *)((long)puVar26 + 6),
               (ulong)(uint)(int)(short)puVar26[2],(ulong)(uint)(int)*(short *)((long)puVar26 + 10),
               (ulong)(byte)puVar26[3]);
          puVar26 = (uint *)((long)puVar26 + (long)(int)puVar26[-1]);
        } while (puVar26 !=
                 (uint *)((pIVar19->SettingsWindows).Buf.Data +
                         (long)(pIVar19->SettingsWindows).Buf.Size + 4));
      }
      TreePop();
    }
    bVar11 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar19->SettingsTables).Buf.Size);
    if (bVar11) {
      pcVar15 = (pIVar19->SettingsTables).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        settings = (ImGuiTableSettings *)(pcVar15 + 4);
        do {
          DebugNodeTableSettings(settings);
          iVar16._0_1_ = settings[-1].ColumnsCount;
          iVar16._1_1_ = settings[-1].ColumnsCountMax;
          iVar16._2_1_ = settings[-1].WantApply;
          iVar16._3_1_ = settings[-1].field_0xf;
          settings = (ImGuiTableSettings *)((long)&settings->ID + (long)iVar16);
        } while (settings !=
                 (ImGuiTableSettings *)
                 ((pIVar19->SettingsTables).Buf.Data + (long)(pIVar19->SettingsTables).Buf.Size + 4)
                );
      }
      TreePop();
    }
    iVar16 = (pIVar19->SettingsIniData).Buf.Size;
    uVar25 = (ulong)(iVar16 - 1);
    if (iVar16 == 0) {
      uVar25 = 0;
    }
    bVar11 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar25);
    if (bVar11) {
      pcVar15 = (pIVar19->SettingsIniData).Buf.Data;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = ImGuiTextBuffer::EmptyString;
      }
      buf._4_4_ = GImGui->FontSize * 20.0;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = -0x80;
      InputTextMultiline("##Ini",pcVar15,(long)(pIVar19->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar11 = TreeNode("Internal state");
  if (bVar11) {
    Text("WINDOWING");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar14 = "NULL";
    pcVar15 = "NULL";
    if (pIVar19->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar19->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar19->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar19->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar15);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ITEMS");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar19->ActiveIdTimer,0),(ulong)pIVar19->ActiveId,
         (ulong)pIVar19->ActiveIdPreviousFrame,(ulong)pIVar19->ActiveIdAllowOverlap,
         (&PTR_anon_var_dwarf_8340f_0019ab20)[pIVar19->ActiveIdSource]);
    pcVar15 = "NULL";
    if (pIVar19->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar15);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
         SUB84((double)pIVar19->HoveredIdTimer,0),(ulong)pIVar19->HoveredId,
         (ulong)pIVar19->HoveredIdPreviousFrame,(ulong)pIVar19->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar19->DragDropActive
         ,(ulong)(pIVar19->DragDropPayload).SourceId,(pIVar19->DragDropPayload).DataType,
         (ulong)(uint)(pIVar19->DragDropPayload).DataSize);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("NAV,FOCUS");
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar8->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar15 = "NULL";
    if (pIVar19->NavWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar19->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar15);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar19->NavId,(ulong)pIVar19->NavLayer);
    Text("NavInputSource: %s",(&PTR_anon_var_dwarf_8340f_0019ab20)[pIVar19->NavInputSource]);
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar19->IO).NavActive,
         (ulong)(pIVar19->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar19->NavActivateId,
         (ulong)pIVar19->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar19->NavDisableHighlight,
         (ulong)pIVar19->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar19->NavFocusScopeId);
    if (pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar14 = pIVar19->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar14);
    pIVar8 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar30 = (pIVar3->DC).Indent.x - (pIVar8->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar30;
    (pIVar3->DC).CursorPos.x = fVar30 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    TreePop();
  }
  if (((local_1b8->ShowWindowsRects != false) ||
      ((pIVar19->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
     (0 < *(int *)local_198._0_8_)) {
    lVar13 = 0;
    do {
      pIVar3 = (pIVar19->Windows).Data[lVar13];
      if (pIVar3->WasActive == true) {
        pIVar12 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
        if (local_1b8->ShowWindowsRects == true) {
          buf._0_16_ = (undefined1  [16])ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_1b0);
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        if (((local_1c0->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar3->Flags & 0x1000000) == 0)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
          local_1c8.y = GImGui->FontSize + (pIVar3->Pos).y;
          local_1c8.x = GImGui->FontSize + (pIVar3->Pos).x;
          ImDrawList::AddRectFilled(pIVar12,&pIVar3->Pos,&local_1c8,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(pIVar12,&pIVar3->Pos,0xffffffff,buf,(char *)0x0);
        }
      }
      lVar13 = lVar13 + 1;
      pIVar19 = local_1c0;
    } while (lVar13 < *(int *)local_198._0_8_);
  }
  piVar9 = local_1a8;
  if (((pIVar19->DebugMetricsConfig).ShowTablesRects == true) && (0 < (pIVar19->Tables).Buf.Size)) {
    lVar13 = 0;
    do {
      piVar10 = local_1a8;
      pIVar17 = (pIVar19->Tables).Buf.Data;
      if (pIVar19->FrameCount + -1 <= pIVar17[lVar13].LastFrameActive) {
        pIVar17 = pIVar17 + lVar13;
        pIVar12 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
        if (*piVar10 < 6) {
          buf._0_16_ = (undefined1  [16])ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar10,-1)
          ;
          ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        else if (0 < pIVar17->ColumnsCount) {
          iVar16 = 0;
          do {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar9,iVar16);
            bVar11 = iVar16 == pIVar17->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar11) {
              col = 0xff80ffff;
            }
            ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                *(float *)(&DAT_0017f9fc + (ulong)bVar11 * 4));
            iVar16 = iVar16 + 1;
          } while (iVar16 < pIVar17->ColumnsCount);
        }
      }
      lVar13 = lVar13 + 1;
      pIVar19 = local_1c0;
    } while (lVar13 < (local_1c0->Tables).Buf.Size);
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}